

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGui::NavMoveRequestApplyResult(ImGui *this)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  ImGuiID IVar5;
  ImGuiContext *pIVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImGuiNavLayer IVar9;
  ImGuiContext *pIVar10;
  ImGuiNavItemData *pIVar11;
  float fVar12;
  ImRect rect_abs;
  ImRect local_20;
  
  pIVar10 = GImGui;
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    pIVar11 = (ImGuiNavItemData *)0x0;
    if ((GImGui->NavMoveResultOther).ID != 0) {
      pIVar11 = &GImGui->NavMoveResultOther;
    }
  }
  else {
    pIVar11 = &GImGui->NavMoveResultLocal;
  }
  uVar7 = GImGui->NavMoveFlags;
  if ((uVar7 >> 10 & 1) == 0) {
    if (pIVar11 == (ImGuiNavItemData *)0x0) {
LAB_001f4806:
      if (pIVar10->NavId == 0 || (uVar7 >> 0xc & 1) != 0) {
        return;
      }
      goto LAB_001f481b;
    }
  }
  else if (((GImGui->NavTabbingCounter == 1) || (GImGui->NavTabbingDir == 0)) &&
          ((GImGui->NavTabbingResultFirst).ID != 0)) {
    pIVar11 = &GImGui->NavTabbingResultFirst;
  }
  else if (pIVar11 == (ImGuiNavItemData *)0x0) {
    uVar7 = uVar7 | 0x1000;
    GImGui->NavMoveFlags = uVar7;
    goto LAB_001f4806;
  }
  if ((((uVar7 & 0x20) != 0) && (IVar5 = (GImGui->NavMoveResultLocalVisible).ID, IVar5 != 0)) &&
     (IVar5 != GImGui->NavId)) {
    pIVar11 = &GImGui->NavMoveResultLocalVisible;
  }
  if (((pIVar11 != &GImGui->NavMoveResultOther) && ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    fVar12 = (GImGui->NavMoveResultOther).DistBox;
    fVar3 = pIVar11->DistBox;
    if (fVar3 <= fVar12) {
      if (((fVar12 != fVar3) || (NAN(fVar12) || NAN(fVar3))) ||
         (pfVar1 = &(GImGui->NavMoveResultOther).DistCenter,
         pIVar11->DistCenter < *pfVar1 || pIVar11->DistCenter == *pfVar1)) goto LAB_001f464d;
    }
    pIVar11 = &GImGui->NavMoveResultOther;
  }
LAB_001f464d:
  if (GImGui->NavLayer == ImGuiNavLayer_Main) {
    if ((uVar7 & 0x40) == 0) {
      IVar4 = (pIVar11->Window->DC).CursorStartPos;
      local_20.Max.x = IVar4.x;
      local_20.Max.y = IVar4.y;
      IVar4 = (pIVar11->RectRel).Min;
      local_20.Min.x = IVar4.x + local_20.Max.x;
      local_20.Min.y = IVar4.y + local_20.Max.y;
      IVar4 = (pIVar11->RectRel).Max;
      local_20.Max.x = IVar4.x + local_20.Max.x;
      local_20.Max.y = IVar4.y + local_20.Max.y;
      ScrollToRectEx(pIVar11->Window,&local_20,GImGui->NavMoveScrollFlags);
    }
    else {
      pIVar8 = pIVar11->Window;
      fVar12 = 0.0;
      if (GImGui->NavMoveDir == 2) {
        fVar12 = (pIVar8->ScrollMax).y;
      }
      (pIVar8->ScrollTarget).y = fVar12;
      (pIVar8->ScrollTargetCenterRatio).y = 0.0;
      (pIVar8->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  pIVar8 = pIVar11->Window;
  if (pIVar10->NavWindow != pIVar8) {
    if ((pIVar10->DebugLogFlags & 2) != 0) {
      DebugLog("[focus] NavMoveRequest: SetNavWindow(\"%s\")\n",pIVar8->Name);
      pIVar8 = pIVar11->Window;
    }
    pIVar10->NavWindow = pIVar8;
  }
  uVar7 = pIVar10->ActiveId;
  if (uVar7 != pIVar11->ID) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    uVar7 = pIVar11->ID;
  }
  if (pIVar10->NavId != uVar7) {
    pIVar10->NavJustMovedToId = uVar7;
    pIVar10->NavJustMovedToFocusScopeId = pIVar11->FocusScopeId;
    pIVar10->NavJustMovedToKeyMods = pIVar10->NavMoveKeyMods;
    uVar7 = pIVar11->ID;
  }
  IVar9 = pIVar10->NavLayer;
  if ((pIVar10->DebugLogFlags & 8) != 0) {
    DebugLog("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n",(ulong)uVar7,
             (ulong)IVar9,pIVar10->NavWindow->Name);
    uVar7 = pIVar11->ID;
    IVar9 = pIVar10->NavLayer;
  }
  pIVar6 = GImGui;
  IVar5 = pIVar11->FocusScopeId;
  GImGui->NavId = uVar7;
  pIVar6->NavLayer = IVar9;
  pIVar6->NavFocusScopeId = IVar5;
  pIVar6->NavWindow->NavLastIds[IVar9] = uVar7;
  IVar4 = (pIVar11->RectRel).Max;
  pIVar2 = &pIVar6->NavWindow->NavRectRel[IVar9].Min;
  *pIVar2 = (pIVar11->RectRel).Min;
  pIVar2[1] = IVar4;
  uVar7 = pIVar10->NavMoveFlags;
  if (((uVar7 >> 10 & 1) != 0) && ((pIVar11->InFlags & 0x400) != 0)) {
    pIVar10->NavNextActivateId = pIVar11->ID;
    pIVar10->NavNextActivateFlags = 5;
    uVar7 = uVar7 | 0x1000;
    pIVar10->NavMoveFlags = uVar7;
  }
  if ((uVar7 >> 0xb & 1) != 0) {
    pIVar10->NavNextActivateId = pIVar11->ID;
    pIVar10->NavNextActivateFlags = 0;
  }
  pIVar10 = GImGui;
  if ((uVar7 >> 0xc & 1) != 0) {
    return;
  }
LAB_001f481b:
  pIVar10->NavMousePosDirty = true;
  pIVar10->NavDisableHighlight = false;
  pIVar10->NavDisableMouseHover = true;
  return;
}

Assistant:

void ImGui::NavMoveRequestApplyResult()
{
    ImGuiContext& g = *GImGui;
#if IMGUI_DEBUG_NAV_SCORING
    if (g.NavMoveFlags & ImGuiNavMoveFlags_DebugNoResult) // [DEBUG] Scoring all items in NavWindow at all times
        return;
#endif

    // Select which result to use
    ImGuiNavItemData* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : (g.NavMoveResultOther.ID != 0) ? &g.NavMoveResultOther : NULL;

    // Tabbing forward wrap
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
        if ((g.NavTabbingCounter == 1 || g.NavTabbingDir == 0) && g.NavTabbingResultFirst.ID)
            result = &g.NavTabbingResultFirst;

    // In a situation when there are no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
    if (result == NULL)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing)
            g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
        if (g.NavId != 0 && (g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
            NavRestoreHighlightAfterMove();
        return;
    }

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisible.ID != 0 && g.NavMoveResultLocalVisible.ID != g.NavId)
            result = &g.NavMoveResultLocalVisible;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        if (g.NavMoveFlags & ImGuiNavMoveFlags_ScrollToEdgeY)
        {
            // FIXME: Should remove this
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = WindowRectRelToAbs(result->Window, result->RectRel);
            ScrollToRectEx(result->Window, rect_abs, g.NavMoveScrollFlags);
        }
    }

    if (g.NavWindow != result->Window)
    {
        IMGUI_DEBUG_LOG_FOCUS("[focus] NavMoveRequest: SetNavWindow(\"%s\")\n", result->Window->Name);
        g.NavWindow = result->Window;
    }
    if (g.ActiveId != result->ID)
        ClearActiveID();
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveKeyMods;
    }

    // Focus
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);

    // Tabbing: Activates Inputable or Focus non-Inputable
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) && (result->InFlags & ImGuiItemFlags_Inputable))
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_PreferInput | ImGuiActivateFlags_TryToPreserveState;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DontSetNavHighlight;
    }

    // Activate
    if (g.NavMoveFlags & ImGuiNavMoveFlags_Activate)
    {
        g.NavNextActivateId = result->ID;
        g.NavNextActivateFlags = ImGuiActivateFlags_None;
    }

    // Enable nav highlight
    if ((g.NavMoveFlags & ImGuiNavMoveFlags_DontSetNavHighlight) == 0)
        NavRestoreHighlightAfterMove();
}